

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O3

void do_test(uv_udp_recv_cb recv_cb,int bind_flags)

{
  ushort uVar1;
  int iVar2;
  uv_timer_t *puVar3;
  undefined8 uVar4;
  uv_udp_send_t *in_RCX;
  long *extraout_RDX;
  undefined8 *extraout_RDX_00;
  int iVar5;
  uv_udp_t *puVar6;
  code *pcVar7;
  uv_timer_t *puVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  uv_udp_t *puVar12;
  uv_udp_send_t *puVar13;
  sockaddr_in addr;
  int addr_len;
  int addr6_len;
  sockaddr_in6 addr6;
  char dst [256];
  undefined1 local_16c [16];
  uv_handle_type local_15c;
  undefined4 local_158;
  undefined1 local_154 [28];
  undefined1 local_138 [16];
  undefined1 local_128 [264];
  
  pcVar11 = "::0";
  puVar6 = (uv_udp_t *)0x23a3;
  iVar2 = uv_ip6_addr("::0",0x23a3,local_154);
  if (iVar2 == 0) {
    puVar3 = (uv_timer_t *)uv_default_loop();
    puVar6 = &server;
    iVar2 = uv_udp_init();
    if (iVar2 != 0) goto LAB_00187d9b;
    puVar12 = &server;
    puVar6 = (uv_udp_t *)local_154;
    iVar2 = uv_udp_bind(&server,puVar6,bind_flags);
    puVar3 = (uv_timer_t *)puVar12;
    if (iVar2 != 0) goto LAB_00187da0;
    local_158 = 0x1c;
    puVar12 = &server;
    puVar6 = (uv_udp_t *)local_154;
    iVar2 = uv_udp_getsockname();
    puVar3 = (uv_timer_t *)puVar12;
    if (iVar2 != 0) goto LAB_00187da5;
    puVar6 = (uv_udp_t *)(local_154 + 8);
    puVar3 = (uv_timer_t *)(ulong)(ushort)local_154._0_2_;
    in_RCX = (uv_udp_send_t *)0x100;
    iVar2 = uv_inet_ntop(puVar3,puVar6,local_138 + 0x10);
    if (iVar2 != 0) goto LAB_00187daa;
    in_RCX = (uv_udp_send_t *)(ulong)(ushort)local_154._2_2_;
    printf("on [%.*s]:%d\n",0x100,local_138 + 0x10);
    puVar12 = &server;
    pcVar7 = alloc_cb;
    iVar2 = uv_udp_recv_start(&server,alloc_cb,recv_cb);
    puVar6 = (uv_udp_t *)pcVar7;
    puVar3 = (uv_timer_t *)puVar12;
    if (iVar2 != 0) goto LAB_00187daf;
    puVar3 = (uv_timer_t *)uv_default_loop();
    puVar6 = &client;
    iVar2 = uv_udp_init();
    if (iVar2 != 0) goto LAB_00187db4;
    puVar3 = (uv_timer_t *)0x1a4e6a;
    puVar6 = (uv_udp_t *)0x23a3;
    iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,local_16c);
    if (iVar2 != 0) goto LAB_00187db9;
    pcVar7 = (code *)(local_16c + 4);
    puVar3 = (uv_timer_t *)(ulong)(ushort)local_16c._0_2_;
    in_RCX = (uv_udp_send_t *)0x100;
    puVar6 = (uv_udp_t *)pcVar7;
    iVar2 = uv_inet_ntop(puVar3,pcVar7,local_138 + 0x10);
    if (iVar2 != 0) goto LAB_00187dbe;
    printf("to [%.*s]:%d\n",0x100,local_138 + 0x10,(ulong)(ushort)local_16c._2_2_);
    uVar1 = uv_os_getpid();
    in_RCX = (uv_udp_send_t *)(ulong)uVar1;
    pcVar11 = data;
    puVar6 = (uv_udp_t *)0xa;
    iVar2 = snprintf(data,10,"PING%5u");
    puVar3 = (uv_timer_t *)pcVar11;
    if (iVar2 != 9) goto LAB_00187dc3;
    local_138 = uv_buf_init(data,9);
    printf("sending %s\n",data);
    puVar13 = &req_;
    puVar6 = &client;
    in_RCX = (uv_udp_send_t *)0x1;
    iVar2 = uv_udp_send(&req_,&client,local_138,1,local_16c,send_cb);
    puVar3 = (uv_timer_t *)puVar13;
    if (iVar2 != 0) goto LAB_00187dc8;
    local_15c = UV_SIGNAL;
    puVar12 = &client;
    puVar6 = (uv_udp_t *)local_16c;
    iVar2 = uv_udp_getsockname();
    puVar3 = (uv_timer_t *)puVar12;
    if (iVar2 != 0) goto LAB_00187dcd;
    puVar3 = (uv_timer_t *)(ulong)(ushort)local_16c._0_2_;
    in_RCX = (uv_udp_send_t *)0x100;
    iVar2 = uv_inet_ntop(puVar3,pcVar7,local_138 + 0x10);
    if (iVar2 != 0) goto LAB_00187dd2;
    in_RCX = (uv_udp_send_t *)(ulong)(ushort)local_16c._2_2_;
    printf("from [%.*s]:%d\n",0x100,local_138 + 0x10);
    client_port = local_16c._2_2_;
    puVar3 = (uv_timer_t *)uv_default_loop();
    puVar8 = &timeout;
    iVar2 = uv_timer_init();
    pcVar7 = (code *)puVar8;
    if (iVar2 != 0) goto LAB_00187dd7;
    puVar3 = &timeout;
    pcVar7 = timeout_cb;
    in_RCX = (uv_udp_send_t *)0x0;
    iVar2 = uv_timer_start(&timeout,timeout_cb,500);
    if (iVar2 != 0) goto LAB_00187ddc;
    if (close_cb_called != 0) goto LAB_00187de1;
    if (send_cb_called != 0) goto LAB_00187de6;
    if (recv_cb_called != 0) goto LAB_00187deb;
    puVar3 = (uv_timer_t *)uv_default_loop();
    pcVar7 = (code *)0x0;
    uv_run();
    if (close_cb_called != 3) goto LAB_00187df0;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    pcVar7 = (code *)0x0;
    uv_run(uVar4);
    puVar3 = (uv_timer_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    do_test_cold_1();
    puVar3 = (uv_timer_t *)pcVar11;
LAB_00187d9b:
    do_test_cold_2();
LAB_00187da0:
    do_test_cold_3();
LAB_00187da5:
    do_test_cold_4();
LAB_00187daa:
    do_test_cold_5();
LAB_00187daf:
    do_test_cold_6();
LAB_00187db4:
    do_test_cold_7();
LAB_00187db9:
    do_test_cold_8();
LAB_00187dbe:
    do_test_cold_9();
LAB_00187dc3:
    do_test_cold_10();
LAB_00187dc8:
    do_test_cold_11();
LAB_00187dcd:
    pcVar7 = (code *)puVar6;
    do_test_cold_12();
LAB_00187dd2:
    do_test_cold_13();
LAB_00187dd7:
    do_test_cold_14();
LAB_00187ddc:
    do_test_cold_15();
LAB_00187de1:
    do_test_cold_16();
LAB_00187de6:
    do_test_cold_17();
LAB_00187deb:
    do_test_cold_18();
LAB_00187df0:
    do_test_cold_19();
  }
  do_test_cold_20();
  if (((puVar3 == &timeout) || ((uv_udp_t *)puVar3 == &server)) || ((uv_udp_t *)puVar3 == &client))
  {
    puVar6 = (uv_udp_t *)0x0;
    if (0 < (long)pcVar7) {
      puVar6 = (uv_udp_t *)pcVar7;
    }
    puVar13 = (uv_udp_send_t *)*extraout_RDX;
    printf("got %d %.*s\n",(ulong)pcVar7 & 0xffffffff,puVar6);
    iVar2 = is_from_client((sockaddr *)in_RCX);
    if ((iVar2 == 0) || (in_RCX == (uv_udp_send_t *)0x0 && (uv_udp_t *)pcVar7 == (uv_udp_t *)0x0)) {
      return;
    }
    in_RCX = puVar13;
    if ((uv_udp_t *)pcVar7 != (uv_udp_t *)0x9) goto LAB_00187e92;
    in_RCX = (uv_udp_send_t *)(*(ulong *)*extraout_RDX ^ data._0_8_);
    if ((char)((ulong *)*extraout_RDX)[1] == data[8] && in_RCX == (uv_udp_send_t *)0x0) {
      recv_cb_called = recv_cb_called + 1;
      return;
    }
  }
  else {
    ipv6_recv_ok_cold_1();
LAB_00187e92:
    ipv6_recv_ok_cold_2();
  }
  ipv6_recv_ok_cold_3();
  iVar2 = can_ipv6();
  if (iVar2 == 0) {
    run_test_udp_ipv6_only_cold_3();
    return;
  }
  lVar9 = 1;
  do_test(ipv6_recv_fail,1);
  if (recv_cb_called == 0) {
    if (send_cb_called == 1) {
      return;
    }
  }
  else {
    run_test_udp_ipv6_only_cold_1();
  }
  run_test_udp_ipv6_only_cold_2();
  lVar10 = lVar9;
  printf("got %d %.*s\n");
  iVar5 = (int)lVar10;
  puVar13 = in_RCX;
  iVar2 = is_from_client((sockaddr *)in_RCX);
  if ((iVar2 == 0) || ((lVar9 == 0 && (in_RCX == (uv_udp_send_t *)0x0)))) {
    return;
  }
  ipv6_recv_fail_cold_1();
  if (((puVar13 == (uv_udp_send_t *)&timeout) || (puVar13 == (uv_udp_send_t *)&server)) ||
     (puVar13 == (uv_udp_send_t *)&client)) {
    *extraout_RDX_00 = alloc_cb::slab;
    extraout_RDX_00[1] = 0x10000;
    return;
  }
  alloc_cb_cold_1();
  if (puVar13 == &req_) {
    if (((req_.handle == (uv_udp_t *)&timeout) || (req_.handle == &server)) ||
       (req_.handle == &client)) {
      if (iVar5 == 0) {
        send_cb_called = send_cb_called + 1;
        return;
      }
      goto LAB_00187fba;
    }
    send_cb_cold_2();
  }
  send_cb_cold_1();
LAB_00187fba:
  send_cb_cold_3();
  uv_close(&server,close_cb);
  uv_close(&client,close_cb);
  uv_close(&timeout,close_cb);
  return;
}

Assistant:

static void do_test(uv_udp_recv_cb recv_cb, int bind_flags) {
  struct sockaddr_in6 addr6;
  struct sockaddr_in addr;
  int addr6_len;
  int addr_len;
  uv_buf_t buf;
  char dst[256];
  int r;

  ASSERT(0 == uv_ip6_addr("::0", TEST_PORT, &addr6));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr6, bind_flags);
  ASSERT(r == 0);

  addr6_len = sizeof(addr6);
  ASSERT(uv_udp_getsockname(&server, (struct sockaddr*) &addr6, &addr6_len) == 0);
  ASSERT(uv_inet_ntop(addr6.sin6_family, &addr6.sin6_addr, dst, sizeof(dst)) == 0);
  printf("on [%.*s]:%d\n", (int) sizeof(dst), dst, addr6.sin6_port);

  r = uv_udp_recv_start(&server, alloc_cb, recv_cb);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(uv_inet_ntop(addr.sin_family, &addr.sin_addr, dst, sizeof(dst)) == 0);
  printf("to [%.*s]:%d\n", (int) sizeof(dst), dst, addr.sin_port);

  /* Create some unique data to send */
  ASSERT(9 == snprintf(data, sizeof(data), "PING%5u", uv_os_getpid() & 0xFFFF));
  buf = uv_buf_init(data, 9);
  printf("sending %s\n", data);

  r = uv_udp_send(&req_,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

  addr_len = sizeof(addr);
  ASSERT(uv_udp_getsockname(&client, (struct sockaddr*) &addr, &addr_len) == 0);
  ASSERT(uv_inet_ntop(addr.sin_family, &addr.sin_addr, dst, sizeof(dst)) == 0);
  printf("from [%.*s]:%d\n", (int) sizeof(dst), dst, addr.sin_port);
  client_port = addr.sin_port;

  r = uv_timer_init(uv_default_loop(), &timeout);
  ASSERT(r == 0);

  r = uv_timer_start(&timeout, timeout_cb, 500, 0);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(send_cb_called == 0);
  ASSERT(recv_cb_called == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 3);

  MAKE_VALGRIND_HAPPY();
}